

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_soundfile.c
# Opt level: O1

t_soundfile_type * soundfile_findtype(char *name)

{
  long lVar1;
  t_soundfile_type *ptVar2;
  int iVar3;
  t_soundfile_type **pptVar4;
  bool bVar5;
  
  lVar1 = sf_numtypes * 8;
  pptVar4 = sf_types;
  do {
    ptVar2 = *pptVar4;
    iVar3 = strcmp(name,ptVar2->t_name);
    if (iVar3 == 0) {
      return ptVar2;
    }
    bVar5 = (t_soundfile_type **)(lVar1 + 0x1e4688) != pptVar4;
    pptVar4 = pptVar4 + 1;
  } while (bVar5);
  return (t_soundfile_type *)0x0;
}

Assistant:

static t_soundfile_type *soundfile_findtype(const char *name)
{
    t_soundfile_type **t = soundfile_firsttype();
    while (t)
    {
        if (!strcmp(name, (*t)->t_name))
            break;
        t = soundfile_nexttype(t);
    }
    return (t ? *t : NULL);
}